

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void X86_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint uVar6;
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar4 = insn_find((insn_map *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                    (unsigned_short **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                   );
  uVar5 = (uint)uVar4;
  if (uVar5 == 0) {
    return;
  }
  *in_RSI = (uint)insns[(int)uVar5].mapid;
  if (*(int *)(in_RDI + 0x60) == 0) {
    return;
  }
  puVar2 = *(undefined8 **)(in_RSI + 0x3c);
  puVar2[2] = *(undefined8 *)(insns[(int)uVar5].regs_use + 8);
  uVar3 = *(undefined8 *)(insns[(int)uVar5].regs_use + 4);
  *puVar2 = *(undefined8 *)insns[(int)uVar5].regs_use;
  puVar2[1] = uVar3;
  uVar6 = count_positive(insns[(int)uVar5].regs_use);
  *(char *)(*(long *)(in_RSI + 0x3c) + 0x20) = (char)uVar6;
  if (in_EDX == 0x95a) {
    if (*(int *)(in_RDI + 4) == 8) {
      memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[(int)uVar5].regs_mod,0x28);
      uVar6 = count_positive(insns[(int)uVar5].regs_mod);
      *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar6;
    }
    else {
      *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x13;
      *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x24) = 0x18;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 2;
    }
  }
  else if (in_EDX == 0x95b) {
    if (*(int *)(in_RDI + 4) == 8) {
      memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[(int)uVar5].regs_mod,0x28);
      uVar6 = count_positive(insns[(int)uVar5].regs_mod);
      *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar6;
    }
    else {
      *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x13;
      *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x24) = 0x16;
      *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x26) = 0x18;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 3;
    }
  }
  else {
    memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[(int)uVar5].regs_mod,0x28);
    uVar6 = count_positive(insns[(int)uVar5].regs_mod);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar6;
  }
  uVar6 = *in_RSI;
  if (2 < uVar6 - 0x60) {
    if (uVar6 == 0x93) {
      if (*(int *)(in_RDI + 4) == 2) {
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x2f;
        **(undefined2 **)(in_RSI + 0x3c) = 0x2f;
      }
      else if (*(int *)(in_RDI + 4) == 4) {
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x1e;
        **(undefined2 **)(in_RSI + 0x3c) = 0x1e;
      }
      else {
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x2c;
        **(undefined2 **)(in_RSI + 0x3c) = 0x2c;
      }
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 1;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x20) = 1;
      goto LAB_00359e69;
    }
    if (uVar6 - 0x14f < 4) {
      if (*(int *)(in_RDI + 4) == 2) {
        arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                    X86_REG_ESI,X86_REG_SI);
        arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                    *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_ESI,X86_REG_SI);
      }
      else if (*(int *)(in_RDI + 4) == 8) {
        arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                    X86_REG_ESI,X86_REG_RSI);
        arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                    *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_ESI,X86_REG_RSI);
      }
      goto LAB_00359e69;
    }
    if (uVar6 - 0x153 < 3) {
      iVar1 = *(int *)(in_RDI + 4);
      if (iVar1 == 2) {
        **(undefined2 **)(in_RSI + 0x3c) = 0xc;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x20) = 1;
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0xc;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 1;
      }
      else if (iVar1 == 4) {
        **(undefined2 **)(in_RSI + 0x3c) = 0x16;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x20) = 1;
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x16;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 1;
      }
      else if (iVar1 == 8) {
        **(undefined2 **)(in_RSI + 0x3c) = 0x26;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x20) = 1;
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22) = 0x26;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x4a) = 1;
      }
      if (*in_RSI != 0x153) {
        *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 2) = 0x19;
        *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x20) = 2;
      }
      goto LAB_00359e69;
    }
    if (((1 < uVar6 - 0x1d6) && (uVar6 != 0x1da)) && (uVar6 != 0x1dc)) {
      if (((uVar6 == 0x26e) || (uVar6 - 0x270 < 2)) || (uVar6 - 0x2a3 < 4)) {
        if (*(int *)(in_RDI + 4) == 2) {
          arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                      X86_REG_EDI,X86_REG_DI);
          arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                      *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_EDI,X86_REG_DI);
        }
        else if (*(int *)(in_RDI + 4) == 8) {
          arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                      X86_REG_EDI,X86_REG_RDI);
          arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                      *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_EDI,X86_REG_RDI);
        }
        goto LAB_00359e69;
      }
      if (uVar6 != 0x53b) goto LAB_00359e69;
    }
  }
  if (*(int *)(in_RDI + 4) == 2) {
    arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                X86_REG_EDI,X86_REG_DI);
    arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_EDI,X86_REG_DI);
    arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                X86_REG_ESI,X86_REG_SI);
    arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_ESI,X86_REG_SI);
  }
  else if (*(int *)(in_RDI + 4) == 8) {
    arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                X86_REG_EDI,X86_REG_RDI);
    arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_EDI,X86_REG_RDI);
    arr_replace(*(uint16_t **)(in_RSI + 0x3c),*(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x20),
                X86_REG_ESI,X86_REG_RSI);
    arr_replace((uint16_t *)(*(long *)(in_RSI + 0x3c) + 0x22),
                *(uint8_t *)(*(long *)(in_RSI + 0x3c) + 0x4a),X86_REG_ESI,X86_REG_RSI);
  }
LAB_00359e69:
  *(undefined8 *)(*(long *)(in_RSI + 0x3c) + 0x4b) = *(undefined8 *)insns[(int)uVar5].groups;
  uVar6 = count_positive8(insns[(int)uVar5].groups);
  *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = (char)uVar6;
  if (((insns[(int)uVar5].branch & 1U) != 0) || ((insns[(int)uVar5].indirect_branch & 1U) != 0)) {
    *(undefined1 *)
     (*(long *)(in_RSI + 0x3c) + 0x4b + (ulong)*(byte *)(*(long *)(in_RSI + 0x3c) + 0x53)) = 1;
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) + '\x01'
    ;
  }
  uVar4 = insns[(int)uVar5].id;
  if ((((uVar4 == 0x78a) || (uVar4 == 0x78c)) || (uVar4 == 0x78e)) &&
     (*(long *)(*(long *)(in_RSI + 0x3c) + 0xa8) == -0x4e)) {
    *(undefined1 *)
     (*(long *)(in_RSI + 0x3c) + 0x4b + (ulong)*(byte *)(*(long *)(in_RSI + 0x3c) + 0x53)) = 4;
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) + '\x01'
    ;
  }
  return;
}

Assistant:

void X86_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			// special cases when regs_write[] depends on arch
			switch(id) {
				default:
					memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
					insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					break;
				case X86_RDTSC:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_EDX;
						insn->detail->regs_write_count = 2;
					}
					break;
				case X86_RDTSCP:
					if (h->mode == CS_MODE_64) {
						memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
						insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);
					} else {
						insn->detail->regs_write[0] = X86_REG_EAX;
						insn->detail->regs_write[1] = X86_REG_ECX;
						insn->detail->regs_write[2] = X86_REG_EDX;
						insn->detail->regs_write_count = 3;
					}
					break;
			}

			switch(insn->id) {
				default:
					break;

				case X86_INS_LOOP:
				case X86_INS_LOOPE:
				case X86_INS_LOOPNE:
					switch(h->mode) {
						default: break;
						case CS_MODE_16:
								 insn->detail->regs_read[0] = X86_REG_CX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_CX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_32:
								 insn->detail->regs_read[0] = X86_REG_ECX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_ECX;
								 insn->detail->regs_write_count = 1;
								 break;
						case CS_MODE_64:
								 insn->detail->regs_read[0] = X86_REG_RCX;
								 insn->detail->regs_read_count = 1;
								 insn->detail->regs_write[0] = X86_REG_RCX;
								 insn->detail->regs_write_count = 1;
								 break;
					}

					// LOOPE & LOOPNE also read EFLAGS
					if (insn->id != X86_INS_LOOP) {
						insn->detail->regs_read[1] = X86_REG_EFLAGS;
						insn->detail->regs_read_count = 2;
					}

					break;

				case X86_INS_LODSB:
				case X86_INS_LODSD:
				case X86_INS_LODSQ:
				case X86_INS_LODSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_SCASB:
				case X86_INS_SCASW:
				case X86_INS_SCASQ:
				case X86_INS_STOSB:
				case X86_INS_STOSD:
				case X86_INS_STOSQ:
				case X86_INS_STOSW:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							break;
					}
					break;

				case X86_INS_CMPSB:
				case X86_INS_CMPSD:
				case X86_INS_CMPSQ:
				case X86_INS_CMPSW:
				case X86_INS_MOVSB:
				case X86_INS_MOVSW:
				case X86_INS_MOVSD:
				case X86_INS_MOVSQ:
					switch(h->mode) {
						default:
							break;
						case CS_MODE_16:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_DI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_SI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_SI);
							break;
						case CS_MODE_64:
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_EDI, X86_REG_RDI);
							arr_replace(insn->detail->regs_read, insn->detail->regs_read_count, X86_REG_ESI, X86_REG_RSI);
							arr_replace(insn->detail->regs_write, insn->detail->regs_write_count, X86_REG_ESI, X86_REG_RSI);
							break;
					}
					break;

				case X86_INS_RET:
					switch(h->mode) {
						case CS_MODE_16:
							insn->detail->regs_write[0] = X86_REG_SP;
							insn->detail->regs_read[0] = X86_REG_SP;
							break;
						case CS_MODE_32:
							insn->detail->regs_write[0] = X86_REG_ESP;
							insn->detail->regs_read[0] = X86_REG_ESP;
							break;
						default:	// 64-bit
							insn->detail->regs_write[0] = X86_REG_RSP;
							insn->detail->regs_read[0] = X86_REG_RSP;
							break;
					}
					insn->detail->regs_write_count = 1;
					insn->detail->regs_read_count = 1;
					break;
			}

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = X86_GRP_JUMP;
				insn->detail->groups_count++;
			}

			switch (insns[i].id) {
				case X86_OUT8ir:
				case X86_OUT16ir:
				case X86_OUT32ir:
					if (insn->detail->x86.operands[0].imm == -78) {
						// Writing to port 0xb2 causes an SMI on most platforms
						// See: http://cs.gmu.edu/~tr-admin/papers/GMU-CS-TR-2011-8.pdf
						insn->detail->groups[insn->detail->groups_count] = X86_GRP_INT;
						insn->detail->groups_count++;
					}
					break;

				default:
					break;
			}
#endif
		}
	}
}